

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O3

libcaption_stauts_t caption_frame_decode_text(caption_frame_t *frame,uint16_t cc_data)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  char char2 [5];
  char char1 [5];
  int chan;
  char local_26 [5];
  char local_21 [5];
  int local_1c;
  
  iVar3 = eia608_to_utf8(cc_data,&local_1c,local_21,local_26);
  if ((cc_data & 0x7660) == 0x1220) {
    cVar1 = (frame->state).col;
    bVar2 = cVar1 - 1;
    if (cVar1 < '\x01') {
      bVar2 = 0;
    }
    (frame->state).col = bVar2;
    caption_frame_write_char(frame,(int)(frame->state).row,(uint)bVar2,eia608_style_white,0,"");
  }
  if (iVar3 != 0) {
    eia608_write_char(frame,local_21);
    if (iVar3 != 1) {
      eia608_write_char(frame,local_26);
    }
  }
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t caption_frame_decode_text(caption_frame_t* frame, uint16_t cc_data)
{
    int chan;
    char char1[5], char2[5];
    size_t chars = eia608_to_utf8(cc_data, &chan, &char1[0], &char2[0]);

    if (eia608_is_westeu(cc_data)) {
        // Extended charcters replace the previous charcter for back compatibility
        caption_frame_backspace(frame);
    }

    if (0 < chars) {
        eia608_write_char(frame, char1);
    }

    if (1 < chars) {
        eia608_write_char(frame, char2);
    }

    return LIBCAPTION_OK;
}